

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

InvertibleRepresentation * __thiscall
HFactor::getInvert(InvertibleRepresentation *__return_storage_ptr__,HFactor *this)

{
  memset(__return_storage_ptr__,0,600);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->l_pivot_index,&this->l_pivot_index);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->l_pivot_lookup,&this->l_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->l_start,&this->l_start)
  ;
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->l_index,&this->l_index)
  ;
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->l_value,&this->l_value);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->lr_start,&this->lr_start);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->lr_index,&this->lr_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->lr_value,&this->lr_value);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->u_pivot_lookup,&this->u_pivot_lookup);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->u_pivot_index,&this->u_pivot_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->u_pivot_value,&this->u_pivot_value);
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->u_start,&this->u_start)
  ;
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->u_last_p,&this->u_last_p);
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->u_index,&this->u_index)
  ;
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->u_value,&this->u_value);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->ur_start,&this->ur_start);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->ur_lastp,&this->ur_lastp);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->ur_space,&this->ur_space);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->ur_index,&this->ur_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->ur_value,&this->ur_value);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->pf_start,&this->pf_start);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->pf_index,&this->pf_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->pf_value,&this->pf_value);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->pf_pivot_index,&this->pf_pivot_index);
  std::vector<double,_std::allocator<double>_>::operator=
            (&__return_storage_ptr__->pf_pivot_value,&this->pf_pivot_value);
  return __return_storage_ptr__;
}

Assistant:

InvertibleRepresentation HFactor::getInvert() const {
  InvertibleRepresentation invert;
  invert.l_pivot_index = this->l_pivot_index;
  invert.l_pivot_lookup = this->l_pivot_lookup;
  invert.l_start = this->l_start;
  invert.l_index = this->l_index;
  invert.l_value = this->l_value;
  invert.lr_start = this->lr_start;
  invert.lr_index = this->lr_index;
  invert.lr_value = this->lr_value;

  invert.u_pivot_lookup = this->u_pivot_lookup;
  invert.u_pivot_index = this->u_pivot_index;
  invert.u_pivot_value = this->u_pivot_value;
  invert.u_start = this->u_start;
  invert.u_last_p = this->u_last_p;
  invert.u_index = this->u_index;
  invert.u_value = this->u_value;

  invert.ur_start = this->ur_start;
  invert.ur_lastp = this->ur_lastp;
  invert.ur_space = this->ur_space;
  invert.ur_index = this->ur_index;
  invert.ur_value = this->ur_value;
  invert.pf_start = this->pf_start;
  invert.pf_index = this->pf_index;
  invert.pf_value = this->pf_value;
  invert.pf_pivot_index = this->pf_pivot_index;
  invert.pf_pivot_value = this->pf_pivot_value;
  return invert;
}